

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O2

randomx_flags randomx_get_flags(void)

{
  randomx_argon2_impl *prVar1;
  randomx_flags rVar2;
  randomx_flags rVar3;
  Cpu cpu;
  Cpu local_1b;
  
  randomx::Cpu::Cpu(&local_1b);
  rVar2 = (uint)local_1b.aes_ * 2 + RANDOMX_FLAG_JIT;
  prVar1 = randomx_argon2_impl_avx2();
  rVar3 = (uint)local_1b.aes_ * 2 + (RANDOMX_FLAG_ARGON2_AVX2|RANDOMX_FLAG_JIT);
  if ((local_1b.avx2_ & 1U) == 0) {
    rVar3 = rVar2;
  }
  if (prVar1 == (randomx_argon2_impl *)0x0) {
    rVar3 = rVar2;
  }
  prVar1 = randomx_argon2_impl_ssse3();
  rVar2 = rVar3 + RANDOMX_FLAG_ARGON2_SSSE3;
  if ((local_1b.ssse3_ & 1U) == 0) {
    rVar2 = rVar3;
  }
  if (prVar1 == (randomx_argon2_impl *)0x0) {
    rVar2 = rVar3;
  }
  return rVar2;
}

Assistant:

randomx_flags randomx_get_flags() {
		randomx_flags flags = RANDOMX_HAVE_COMPILER ? RANDOMX_FLAG_JIT : RANDOMX_FLAG_DEFAULT;
		randomx::Cpu cpu;
#ifdef RANDOMX_FORCE_SECURE
		if (flags == RANDOMX_FLAG_JIT) {
			flags |= RANDOMX_FLAG_SECURE;
		}
#endif
		if (HAVE_AES && cpu.hasAes()) {
			flags |= RANDOMX_FLAG_HARD_AES;
		}
		if (randomx_argon2_impl_avx2() != nullptr && cpu.hasAvx2()) {
			flags |= RANDOMX_FLAG_ARGON2_AVX2;
		}
		if (randomx_argon2_impl_ssse3() != nullptr && cpu.hasSsse3()) {
			flags |= RANDOMX_FLAG_ARGON2_SSSE3;
		}
		return flags;
	}